

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O3

string * __thiscall
glcts::TestCaseBase::specializeShader_abi_cxx11_
          (string *__return_storage_ptr__,TestCaseBase *this,uint parts,char **code)

{
  char *__s;
  string *psVar1;
  size_t sVar2;
  ulong uVar3;
  stringstream code_merged;
  allocator<char> local_221;
  string *local_220;
  long *local_218;
  long local_208 [2];
  string local_1f8;
  StringTemplate local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_220 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (parts != 0) {
    uVar3 = 0;
    do {
      __s = code[uVar3];
      if (__s == (char *)0x0) {
        std::ios::clear((int)(ostream *)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
      }
      else {
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar2);
      }
      uVar3 = uVar3 + 1;
    } while (parts != uVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,(char *)local_218,&local_221);
  tcu::StringTemplate::StringTemplate(&local_1d8,&local_1f8);
  psVar1 = local_220;
  tcu::StringTemplate::specialize(local_220,&local_1d8,&this->m_specializationMap);
  tcu::StringTemplate::~StringTemplate(&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  if (local_218 != local_208) {
    operator_delete(local_218,local_208[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar1;
}

Assistant:

std::string TestCaseBase::specializeShader(const unsigned int parts, const char* const* code) const
{
	std::stringstream code_merged;
	for (unsigned int i = 0; i < parts; i++)
	{
		code_merged << code[i];
	}
	return tcu::StringTemplate(code_merged.str().c_str()).specialize(m_specializationMap);
}